

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

void remove_comments(char *string,char *start_token,char *end_token)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  size_t sVar4;
  char *pcVar5;
  char cVar6;
  char cVar7;
  char *__haystack;
  
  __n = strlen(start_token);
  sVar4 = strlen(end_token);
  if ((sVar4 != 0 && __n != 0) && (cVar6 = *string, cVar6 != '\0')) {
    bVar1 = false;
    do {
      cVar7 = cVar6;
      if (cVar6 == '\\') {
        pcVar5 = string + 1;
        if (*pcVar5 == '\0') {
          return;
        }
        string = string + 1;
        cVar7 = *pcVar5;
      }
      if (cVar7 == '\"' && cVar6 != '\\') {
        bVar1 = !bVar1;
      }
      else {
        bVar2 = !bVar1;
        bVar1 = true;
        if (bVar2) {
          iVar3 = strncmp(string,start_token,__n);
          bVar1 = false;
          if (iVar3 == 0) {
            memset(string,0x20,__n);
            __haystack = string + __n;
            pcVar5 = strstr(__haystack,end_token);
            if (pcVar5 == (char *)0x0) {
              return;
            }
            if (pcVar5 + (sVar4 - (long)__haystack) != (char *)0x0) {
              memset(__haystack,0x20,(size_t)(pcVar5 + (sVar4 - (long)__haystack)));
            }
            string = pcVar5 + (sVar4 - 1);
          }
        }
      }
      cVar6 = string[1];
      string = string + 1;
    } while (cVar6 != '\0');
  }
  return;
}

Assistant:

static void remove_comments(char *string, const char *start_token, const char *end_token) {
    parson_bool_t in_string = PARSON_FALSE, escaped = PARSON_FALSE;
    size_t i;
    char *ptr = NULL, current_char;
    size_t start_token_len = strlen(start_token);
    size_t end_token_len = strlen(end_token);
    if (start_token_len == 0 || end_token_len == 0) {
        return;
    }
    while ((current_char = *string) != '\0') {
        if (current_char == '\\' && !escaped) {
            escaped = PARSON_TRUE;
            string++;
            continue;
        } else if (current_char == '\"' && !escaped) {
            in_string = !in_string;
        } else if (!in_string && strncmp(string, start_token, start_token_len) == 0) {
            for(i = 0; i < start_token_len; i++) {
                string[i] = ' ';
            }
            string = string + start_token_len;
            ptr = strstr(string, end_token);
            if (!ptr) {
                return;
            }
            for (i = 0; i < (ptr - string) + end_token_len; i++) {
                string[i] = ' ';
            }
            string = ptr + end_token_len - 1;
        }
        escaped = PARSON_FALSE;
        string++;
    }
}